

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  Atom AVar1;
  int iVar2;
  unsigned_long uVar3;
  _GLFWwindow *window;
  double dVar4;
  double dVar5;
  int *piStack_120;
  int *piStack_118;
  int *piStack_110;
  int *piStack_108;
  timeval tStack_100;
  undefined4 auStack_f0 [8];
  undefined8 uStack_d0;
  Atom AStack_c8;
  undefined4 uStack_c0;
  int iStack_94;
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_120 = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS == 0) {
    return;
  }
  piStack_108 = top;
  XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x270),auStack_f0);
  AVar1 = _glfw.x11.NET_REQUEST_FRAME_EXTENTS;
  if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS != 0 && iStack_94 != 2) {
    piStack_118 = right;
    piStack_110 = bottom;
    memset(auStack_f0,0,0xc0);
    auStack_f0[0] = 0x21;
    uStack_d0 = *(undefined8 *)(handle + 0x270);
    uStack_c0 = 0x20;
    AStack_c8 = AVar1;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,auStack_f0);
    dVar4 = _glfwPlatformGetTime();
    iVar2 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle);
    right = piStack_118;
    bottom = piStack_110;
    if (iVar2 == 0) {
      do {
        dVar5 = _glfwPlatformGetTime();
        dVar5 = (dVar4 + 0.5) - dVar5;
        if (dVar5 <= 0.0) {
          _glfwInputError(0x10008,
                          "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                         );
          return;
        }
        tStack_100.tv_sec = 0;
        tStack_100.tv_usec = (__suseconds_t)(dVar5 * 1000000.0);
        selectDisplayConnection(&tStack_100);
        iVar2 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle);
        right = piStack_118;
        bottom = piStack_110;
      } while (iVar2 == 0);
    }
  }
  uVar3 = _glfwGetWindowProperty
                    (*(Window *)(handle + 0x270),_glfw.x11.NET_FRAME_EXTENTS,6,
                     (uchar **)&piStack_120);
  if (uVar3 == 4) {
    if (left != (int *)0x0) {
      *left = *piStack_120;
    }
    if (piStack_108 != (int *)0x0) {
      *piStack_108 = piStack_120[4];
    }
    if (right != (int *)0x0) {
      *right = piStack_120[2];
    }
    if (bottom != (int *)0x0) {
      *bottom = piStack_120[6];
      goto LAB_001c1e7c;
    }
  }
  if (piStack_120 == (int *)0x0) {
    return;
  }
LAB_001c1e7c:
  XFree();
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}